

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_generators.hpp
# Opt level: O3

string * __thiscall
Catch::Generators::IGenerator<std::tuple<long_double,long_double,long_double>>::
stringifyImpl_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  (**(code **)(*this + 0x20))(this);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  *(undefined4 *)&__return_storage_ptr__->field_2 = 0x7d3f7b;
  __return_storage_ptr__->_M_string_length = 3;
  return __return_storage_ptr__;
}

Assistant:

std::string stringifyImpl() const override {
            return ::Catch::Detail::stringify( get() );
        }